

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall t_perl_generator::generate_enum(t_perl_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar4;
  string *psVar5;
  iterator iStack_78;
  int value;
  t_enum_value **local_70;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_68;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_38;
  t_enum *local_18;
  t_enum *tenum_local;
  t_perl_generator *this_local;
  
  local_18 = tenum;
  tenum_local = (t_enum *)this;
  poVar3 = std::operator<<((ostream *)&this->f_types_,"package ");
  perl_namespace_abi_cxx11_(&local_38,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar3 = std::operator<<(poVar3,(string *)&local_38);
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  __x = t_enum::get_constants(local_18);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_68);
  local_70 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_68._M_current = local_70;
  while( true ) {
    iStack_78 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                          ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff88);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_68);
    iVar2 = t_enum_value::get_value(*pptVar4);
    poVar3 = std::operator<<((ostream *)&this->f_types_,"use constant ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_68);
    psVar5 = t_enum_value::get_name_abi_cxx11_(*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    poVar3 = std::operator<<(poVar3," => ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_68);
  }
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  return;
}

Assistant:

void t_perl_generator::generate_enum(t_enum* tenum) {
  f_types_ << "package " << perl_namespace(program_) << tenum->get_name() << ";" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    f_types_ << "use constant " << (*c_iter)->get_name() << " => " << value << ";" << endl;
  }
}